

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall
QGridLayout::addWidget
          (QGridLayout *this,QWidget *widget,int fromRow,int fromColumn,int rowSpan,int columnSpan,
          Alignment alignment)

{
  QGridLayoutPrivate *this_00;
  int row2;
  int col2;
  bool bVar1;
  QGridBox *box;
  QWidgetItem *this_01;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkWidget(&this_00->super_QLayoutPrivate,widget);
  if (bVar1) {
    row2 = fromRow + rowSpan + -1;
    if (rowSpan < 0) {
      row2 = -1;
    }
    col2 = fromColumn + columnSpan + -1;
    if (columnSpan < 0) {
      col2 = -1;
    }
    QLayout::addChildWidget(&this->super_QLayout,widget);
    box = (QGridBox *)operator_new(0x18);
    this_01 = QLayoutPrivate::createWidgetItem(&this->super_QLayout,widget);
    box->item_ = &this_01->super_QLayoutItem;
    QLayoutItem::setAlignment(&this_01->super_QLayoutItem,alignment);
    QGridLayoutPrivate::add(this_00,box,fromRow,row2,fromColumn,col2);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    return;
  }
  return;
}

Assistant:

void QGridLayout::addWidget(QWidget *widget, int fromRow, int fromColumn,
                            int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    if (!d->checkWidget(widget))
        return;
    int toRow = (rowSpan < 0) ? -1 : fromRow + rowSpan - 1;
    int toColumn = (columnSpan < 0) ? -1 : fromColumn + columnSpan - 1;
    addChildWidget(widget);
    QGridBox *b = new QGridBox(this, widget);
    b->setAlignment(alignment);
    d->add(b, fromRow, toRow, fromColumn, toColumn);
    invalidate();
}